

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_scc(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 ret;
  TCGv_i32 pTVar1;
  uintptr_t o;
  DisasCompare_conflict c;
  DisasCompare_conflict local_48;
  
  tcg_ctx = s->uc->tcg_ctx;
  gen_cc_cond(&local_48,s,insn >> 8 & 0xf);
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_setcond_i32_m68k(tcg_ctx,local_48.tcond,ret,local_48.v1,local_48.v2);
  free_cond(tcg_ctx,&local_48);
  tcg_gen_neg_i32(tcg_ctx,ret,ret);
  pTVar1 = gen_ea(env,s,insn,0,ret,(TCGv_i32 *)0x0,EA_STORE,
                  (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar1 != tcg_ctx->NULL_QREG) {
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    return;
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(scc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    DisasCompare c;
    int cond;
    TCGv tmp;

    cond = (insn >> 8) & 0xf;
    gen_cc_cond(&c, s, cond);

    tmp = tcg_temp_new(tcg_ctx);
    tcg_gen_setcond_i32(tcg_ctx, c.tcond, tmp, c.v1, c.v2);
    free_cond(tcg_ctx, &c);

    tcg_gen_neg_i32(tcg_ctx, tmp, tmp);
    DEST_EA(env, insn, OS_BYTE, tmp, NULL);
    tcg_temp_free(tcg_ctx, tmp);
}